

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O2

ENetOutgoingCommand *
enet_peer_queue_outgoing_command
          (ENetPeer *peer,ENetProtocol *command,ENetPacket *packet,enet_uint32 offset,
          enet_uint16 length)

{
  ENetProtocolAcknowledge EVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ENetOutgoingCommand *outgoingCommand;
  
  outgoingCommand = (ENetOutgoingCommand *)enet_malloc(0x60);
  if (outgoingCommand != (ENetOutgoingCommand *)0x0) {
    EVar1 = command->acknowledge;
    uVar2 = *(undefined8 *)&(command->connect).mtu;
    uVar3 = *(undefined8 *)&(command->connect).channelCount;
    uVar4 = *(undefined8 *)&(command->connect).outgoingBandwidth;
    uVar5 = *(undefined8 *)&(command->connect).connectID;
    *(undefined8 *)((long)&outgoingCommand->command + 0x20) =
         *(undefined8 *)&(command->connect).packetThrottleAcceleration;
    *(undefined8 *)((long)&outgoingCommand->command + 0x28) = uVar5;
    *(undefined8 *)((long)&outgoingCommand->command + 0x10) = uVar3;
    *(undefined8 *)((long)&outgoingCommand->command + 0x18) = uVar4;
    (outgoingCommand->command).acknowledge = EVar1;
    *(undefined8 *)((long)&outgoingCommand->command + 8) = uVar2;
    outgoingCommand->fragmentOffset = offset;
    outgoingCommand->fragmentLength = length;
    outgoingCommand->packet = packet;
    if (packet != (ENetPacket *)0x0) {
      packet->referenceCount = packet->referenceCount + 1;
    }
    enet_peer_setup_outgoing_command(peer,outgoingCommand);
  }
  return outgoingCommand;
}

Assistant:

ENetOutgoingCommand *
enet_peer_queue_outgoing_command (ENetPeer * peer, const ENetProtocol * command, ENetPacket * packet, enet_uint32 offset, enet_uint16 length)
{
    ENetOutgoingCommand * outgoingCommand = (ENetOutgoingCommand *) enet_malloc (sizeof (ENetOutgoingCommand));
    if (outgoingCommand == NULL)
      return NULL;

    outgoingCommand -> command = * command;
    outgoingCommand -> fragmentOffset = offset;
    outgoingCommand -> fragmentLength = length;
    outgoingCommand -> packet = packet;
    if (packet != NULL)
      ++ packet -> referenceCount;

    enet_peer_setup_outgoing_command (peer, outgoingCommand);

    return outgoingCommand;
}